

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O1

RPCHelpMan * wallet::listaddressgroupings(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar4 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  undefined8 uVar7;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff8bc;
  undefined8 in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  code *pcVar9;
  undefined8 in_stack_fffffffffffff8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8e8;
  pointer in_stack_fffffffffffff8f8;
  pointer pRVar10;
  pointer in_stack_fffffffffffff900;
  pointer pRVar11;
  pointer in_stack_fffffffffffff908;
  pointer pRVar12;
  undefined8 in_stack_fffffffffffff910;
  pointer pRVar13;
  pointer pRVar14;
  pointer pRVar15;
  undefined8 in_stack_fffffffffffff930;
  pointer pRVar16;
  pointer pRVar17;
  vector<RPCResult,_std::allocator<RPCResult>_> local_6a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_690;
  vector<RPCResult,_std::allocator<RPCResult>_> local_678;
  RPCResults local_660;
  vector<RPCArg,_std::allocator<RPCArg>_> local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  ulong *local_568;
  undefined8 local_560;
  ulong local_558;
  undefined8 uStack_550;
  ulong *local_548;
  size_type local_540;
  ulong local_538;
  undefined8 uStack_530;
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_4c8;
  long *local_4a8 [2];
  long local_498 [2];
  pointer local_488 [2];
  undefined1 local_478 [152];
  RPCResult local_3e0;
  RPCResult local_358;
  long *local_2d0 [2];
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  RPCResult local_290;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listaddressgroupings","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nLists groups of addresses which have had their common ownership\nmade public by common use as inputs or as the resulting change\nin past transactions\n"
             ,"");
  local_120[0] = local_110;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_488[0] = (pointer)local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"address","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"The bitcoin address","");
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8bc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff8b8;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description._M_string_length = in_stack_fffffffffffff8e0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description.field_2 = in_stack_fffffffffffff8e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff900;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff8f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff908;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_478 + 0x10),STR,m_key_name,description,inner,SUB81(local_488,0));
  local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"amount","");
  std::operator+(&local_4e8,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8bc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff8b8;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_00._M_string_length = in_stack_fffffffffffff8e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_00.field_2 = in_stack_fffffffffffff8e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff900;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff908;
  ::RPCResult::RPCResult
            (&local_3e0,STR_AMOUNT,m_key_name_00,description_00,inner_00,SUB81(&local_4c8,0));
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"label","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"The label","");
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  uVar8 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff8bc;
  auVar4._12_8_ = in_stack_fffffffffffff8c8;
  auVar4._20_8_ = in_stack_fffffffffffff8d0;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff8e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff8e8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult
            (&local_358,STR,(string)(auVar4 << 0x20),SUB81(local_508,0),description_01,inner_01,true
            );
  __l._M_len = 3;
  __l._M_array = (iterator)(local_478 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_6a8,__l,(allocator_type *)&stack0xfffffffffffff8f7);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8bc;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_02._M_string_length = in_stack_fffffffffffff8e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff8e8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar11;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar10;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar12;
  ::RPCResult::RPCResult
            (&local_290,ARR_FIXED,m_key_name_01,description_02,inner_02,SUB81(local_2b0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_290;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_690,__l_00,(allocator_type *)&stack0xfffffffffffff8f6);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8bc;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_03._M_string_length = in_stack_fffffffffffff8e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff8e8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar11;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar12;
  ::RPCResult::RPCResult(&local_1c8,ARR,m_key_name_02,description_03,inner_03,SUB81(local_1e8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_678,__l_01,(allocator_type *)&stack0xfffffffffffff8f5);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8bc;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff8c8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff8d0;
  description_04._M_string_length = in_stack_fffffffffffff8e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  description_04.field_2 = in_stack_fffffffffffff8e8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar11;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar12;
  ::RPCResult::RPCResult(&local_100,ARR,m_key_name_03,description_04,inner_04,SUB81(local_120,0));
  result._4_4_ = in_stack_fffffffffffff8bc;
  result.m_type = uVar8;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff8e8;
  result._64_8_ = pRVar10;
  result.m_description._M_dataplus._M_p = (pointer)pRVar11;
  result.m_description._M_string_length = (size_type)pRVar12;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_description.field_2._8_8_ = pRVar13;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar14;
  result.m_cond._M_string_length = (size_type)pRVar15;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff930;
  result.m_cond.field_2._8_8_ = pRVar16;
  RPCResults::RPCResults(&local_660,result);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"listaddressgroupings","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"");
  HelpExampleCli(&local_588,&local_5a8,&local_5c8);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"listaddressgroupings","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"");
  HelpExampleRpc(&local_5e8,&local_608,&local_628);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    uVar7 = local_588.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_5e8._M_string_length + local_588._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      uVar7 = local_5e8.field_2._M_allocated_capacity;
    }
    if (local_5e8._M_string_length + local_588._M_string_length <= (ulong)uVar7) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_5e8,0,0,local_588._M_dataplus._M_p,local_588._M_string_length);
      goto LAB_00c7a880;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_588,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
LAB_00c7a880:
  local_568 = &local_558;
  puVar2 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_558 = paVar1->_M_allocated_capacity;
    uStack_550 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_558 = paVar1->_M_allocated_capacity;
    local_568 = puVar2;
  }
  local_540 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_568 == &local_558) {
    uStack_530 = uStack_550;
    local_548 = &local_538;
  }
  else {
    local_548 = local_568;
  }
  local_538 = local_558;
  local_560 = 0;
  local_558 = local_558 & 0xffffffffffffff00;
  pcVar9 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:183:9)>
           ::_M_manager;
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:183:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:183:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff8e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff910;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar14;
  examples.m_examples._M_string_length = in_stack_fffffffffffff930;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar15;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar16;
  examples.m_examples.field_2._8_8_ = pRVar17;
  local_568 = &local_558;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff8c8)),description_05,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar9 != (code *)0x0) {
    (*pcVar9)(&stack0xfffffffffffff8c8,&stack0xfffffffffffff8c8,3);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_690);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_cond._M_dataplus._M_p != &local_290.m_cond.field_2) {
    operator_delete(local_290.m_cond._M_dataplus._M_p,
                    local_290.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
    operator_delete(local_290.m_description._M_dataplus._M_p,
                    local_290.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_290.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_key_name._M_dataplus._M_p != &local_290.m_key_name.field_2) {
    operator_delete(local_290.m_key_name._M_dataplus._M_p,
                    local_290.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6a8);
  lVar6 = 0x198;
  do {
    if ((long *)(local_478 + lVar6) != *(long **)((long)local_488 + lVar6)) {
      operator_delete(*(long **)((long)local_488 + lVar6),*(long *)(local_478 + lVar6) + 1);
    }
    if ((long *)((long)local_498 + lVar6) != *(long **)((long)local_4a8 + lVar6)) {
      operator_delete(*(long **)((long)local_4a8 + lVar6),*(long *)((long)local_498 + lVar6) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar6));
    plVar3 = *(long **)((long)&local_4e8._M_dataplus._M_p + lVar6);
    if ((long *)(local_4e8.field_2._M_local_buf + lVar6) != plVar3) {
      operator_delete(plVar3,*(long *)(local_4e8.field_2._M_local_buf + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if (local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_4c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_4c8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff938);
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if (local_488[0] != (pointer)local_478) {
    operator_delete(local_488[0],local_478._0_8_ + 1);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listaddressgroupings()
{
    return RPCHelpMan{"listaddressgroupings",
                "\nLists groups of addresses which have had their common ownership\n"
                "made public by common use as inputs or as the resulting change\n"
                "in past transactions\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::ARR, "", "",
                        {
                            {RPCResult::Type::ARR_FIXED, "", "",
                            {
                                {RPCResult::Type::STR, "address", "The bitcoin address"},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "The label"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listaddressgroupings", "")
            + HelpExampleRpc("listaddressgroupings", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue jsonGroupings(UniValue::VARR);
    std::map<CTxDestination, CAmount> balances = GetAddressBalances(*pwallet);
    for (const std::set<CTxDestination>& grouping : GetAddressGroupings(*pwallet)) {
        UniValue jsonGrouping(UniValue::VARR);
        for (const CTxDestination& address : grouping)
        {
            UniValue addressInfo(UniValue::VARR);
            addressInfo.push_back(EncodeDestination(address));
            addressInfo.push_back(ValueFromAmount(balances[address]));
            {
                const auto* address_book_entry = pwallet->FindAddressBookEntry(address);
                if (address_book_entry) {
                    addressInfo.push_back(address_book_entry->GetLabel());
                }
            }
            jsonGrouping.push_back(std::move(addressInfo));
        }
        jsonGroupings.push_back(std::move(jsonGrouping));
    }
    return jsonGroupings;
},
    };
}